

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

void __thiscall lan::db::print(db *this,size_t tabs,db_bit *bits)

{
  undefined8 uVar1;
  db_bit *local_40;
  ulong local_30;
  register_t i;
  db_bit *buffer;
  db_bit *bits_local;
  size_t tabs_local;
  db *this_local;
  
  local_40 = bits;
  if (bits == (db_bit *)0x0) {
    local_40 = this->first;
  }
  for (i = (register_t)local_40; i != 0; i = *(register_t *)(i + 0x38)) {
    for (local_30 = 0; local_30 < tabs; local_30 = local_30 + 1) {
      printf("\t");
    }
    if (*(int *)(i + 0x20) < 9) {
      uVar1 = std::__cxx11::string::data();
      printf("| %s %d 0x%llx\n",uVar1,(ulong)*(uint *)(i + 0x20),*(undefined8 *)(i + 0x28));
    }
    else {
      if (*(int *)(i + 0x20) == 9) {
        uVar1 = std::__cxx11::string::data();
        printf("[ %s ]:\n",uVar1);
      }
      else {
        uVar1 = std::__cxx11::string::data();
        printf("( %s ):\n",uVar1);
      }
      if (*(long *)(i + 0x40) != 0) {
        print(this,tabs + 1,*(db_bit **)(i + 0x40));
      }
    }
  }
  return;
}

Assistant:

void db::print(size_t tabs, lan::db_bit * bits){
            lan::db_bit * buffer = (bits) ? bits : first;
            while (buffer) {
                for(register_t i=0;i<tabs;i++)printf("\t");
                if(buffer->type < Array){
                    printf("| %s %d 0x%llx\n", buffer->key.data(), buffer->type, (long long)buffer->data);
                } else {
                    if(buffer->type == Array)
                        printf("[ %s ]:\n", buffer->key.data());
                    else printf("( %s ):\n", buffer->key.data());
                    if(buffer->lin)print(tabs+1, buffer->lin);
                } buffer = buffer->nex;
            }
        }